

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

sshcom_key * load_sshcom_key(BinarySource *src,char **errmsg_p)

{
  byte bVar1;
  BinarySource *pBVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  sshcom_key *psVar7;
  strbuf *psVar8;
  byte *__s1;
  char *pcVar9;
  ushort **ppuVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  byte *__s;
  ulong uVar16;
  ptrlen pVar17;
  uchar out [3];
  char base64_bit [4];
  char *local_78;
  uchar local_6b [3];
  sshcom_key *local_68;
  byte local_5c [4];
  char **local_58;
  BinarySource *local_50;
  long local_48;
  ulong local_40;
  byte *local_38;
  
  __s1 = (byte *)0x0;
  psVar7 = (sshcom_key *)safemalloc(1,0x108,0);
  psVar7->comment[0] = '\0';
  psVar8 = strbuf_new_nm();
  psVar7->keyblob = psVar8;
  pVar17 = BinarySource_get_chomped_line(src->binarysource_);
  local_50 = src;
  if (src->binarysource_->err == BSE_NO_ERROR) {
    __s1 = (byte *)mkstr(pVar17);
  }
  local_68 = psVar7;
  local_58 = errmsg_p;
  if (__s1 == (byte *)0x0) {
    local_78 = "unexpected end of file";
LAB_00114c2c:
    __s1 = (byte *)0x0;
  }
  else {
    iVar4 = strcmp((char *)__s1,"---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----");
    if (iVar4 == 0) {
      sVar11 = strlen((char *)__s1);
      smemclr(__s1,sVar11);
      safefree(__s1);
      uVar16 = 0;
      iVar4 = 0;
      do {
        pBVar2 = local_50;
        pVar17 = BinarySource_get_chomped_line(local_50->binarysource_);
        if (pBVar2->binarysource_->err == BSE_NO_ERROR) {
          __s1 = (byte *)mkstr(pVar17);
        }
        else {
          __s1 = (byte *)0x0;
        }
        if (__s1 == (byte *)0x0) {
          __s1 = (byte *)0x0;
          local_78 = "unexpected end of file";
          goto LAB_00114f71;
        }
        iVar5 = strcmp((char *)__s1,"---- END SSH2 ENCRYPTED PRIVATE KEY ----");
        if (iVar5 == 0) {
          safefree(__s1);
          if (psVar7->keyblob->len == 0) {
            local_78 = "key body not present";
            goto LAB_00114c2c;
          }
          if (local_58 == (char **)0x0) {
            return psVar7;
          }
          local_78 = (char *)0x0;
          goto LAB_00114fc4;
        }
        pcVar9 = strchr((char *)__s1,0x3a);
        pbVar15 = __s1;
        if (pcVar9 == (char *)0x0) {
          while (((bVar1 = *pbVar15, (byte)(bVar1 - 0x30) < 10 ||
                  ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
                 ((bVar1 < 0x3e && ((0x2000880000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))
                 )) {
            lVar13 = (long)iVar4;
            iVar4 = iVar4 + 1;
            local_5c[lVar13] = bVar1;
            if (iVar4 == 4) {
              uVar6 = base64_decode_atom((char *)local_5c,local_6b);
              pcVar9 = "invalid base64 encoding";
              if (0 < (int)uVar6) {
                BinarySink_put_data(psVar7->keyblob->binarysink_,local_6b,(ulong)uVar6);
                pcVar9 = local_78;
              }
              iVar4 = 0;
              local_78 = pcVar9;
              if ((int)uVar6 < 1) goto LAB_00114f71;
            }
            pbVar15 = pbVar15 + 1;
          }
          uVar16 = CONCAT71((int7)((ulong)__s1 >> 8),1);
        }
        else {
          if ((uVar16 & 1) != 0) {
            local_78 = "header found in body of key data";
            goto LAB_00114f71;
          }
          *pcVar9 = '\0';
          pbVar15 = (byte *)(pcVar9 + 1);
          iVar5 = (int)pcVar9 - (int)__s1;
          lVar13 = (long)pbVar15 - (long)__s1;
          lVar3 = (long)pbVar15 - (long)__s1 << 0x20;
          local_40 = uVar16;
          local_38 = __s1;
          do {
            lVar14 = lVar3;
            lVar12 = lVar13;
            iVar5 = iVar5 + 1;
            bVar1 = *pbVar15;
            if ((ulong)bVar1 == 0) break;
            ppuVar10 = __ctype_b_loc();
            pbVar15 = pbVar15 + 1;
            lVar13 = lVar12 + 1;
            lVar3 = lVar14 + 0x100000000;
          } while ((*(byte *)((long)*ppuVar10 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
          __s1 = local_38;
          local_48 = lVar14 >> 0x20;
          sVar11 = strlen((char *)(local_38 + local_48));
          if (__s1[(int)lVar12 + (int)sVar11] != 0) {
            __assert_fail("!line[len]",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                          ,0x6fd,"struct sshcom_key *load_sshcom_key(BinarySource *, const char **)"
                         );
          }
          iVar5 = (int)sVar11 + iVar5;
          while (pBVar2 = local_50, __s1[(long)iVar5 + -1] == 0x5c) {
            pVar17 = BinarySource_get_chomped_line(local_50->binarysource_);
            if (pBVar2->binarysource_->err == BSE_NO_ERROR) {
              pcVar9 = mkstr(pVar17);
            }
            else {
              pcVar9 = (char *)0x0;
            }
            if (pcVar9 == (char *)0x0) {
              local_78 = "unexpected end of file";
            }
            else {
              sVar11 = strlen(pcVar9);
              __s1 = (byte *)saferealloc(__s1,(long)((int)sVar11 + iVar5 + 1),1);
              strcpy((char *)(__s1 + (long)iVar5 + -1),pcVar9);
              iVar5 = (int)sVar11 + iVar5 + -1;
              if (__s1[iVar5] != 0) {
                __assert_fail("!line[len]",
                              "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                              ,0x70c,
                              "struct sshcom_key *load_sshcom_key(BinarySource *, const char **)");
              }
              sVar11 = strlen(pcVar9);
              smemclr(pcVar9,sVar11);
              safefree(pcVar9);
            }
            if (pcVar9 == (char *)0x0) goto LAB_00114f71;
          }
          iVar5 = strcmp((char *)__s1,"Comment");
          uVar16 = local_40;
          psVar7 = local_68;
          if (iVar5 == 0) {
            __s = __s1 + local_48;
            pbVar15 = __s;
            if ((*__s == 0x22) && (sVar11 = strlen((char *)__s), __s[sVar11 - 1] == 0x22)) {
              pbVar15 = __s + 1;
              sVar11 = strlen((char *)pbVar15);
              __s[sVar11] = 0;
            }
            psVar7 = local_68;
            strncpy(local_68->comment,(char *)pbVar15,0x100);
            psVar7->comment[0xff] = '\0';
          }
        }
        sVar11 = strlen((char *)__s1);
        smemclr(__s1,sVar11);
        safefree(__s1);
      } while( true );
    }
    local_78 = "file does not begin with ssh.com key header";
  }
LAB_00114f71:
  if (__s1 != (byte *)0x0) {
    sVar11 = strlen((char *)__s1);
    smemclr(__s1,sVar11);
    safefree(__s1);
  }
  psVar7 = local_68;
  strbuf_free(local_68->keyblob);
  smemclr(psVar7,0x108);
  safefree(psVar7);
  psVar7 = (sshcom_key *)0x0;
  if (local_58 != (char **)0x0) {
LAB_00114fc4:
    *local_58 = local_78;
  }
  return psVar7;
}

Assistant:

static struct sshcom_key *load_sshcom_key(BinarySource *src,
                                          const char **errmsg_p)
{
    struct sshcom_key *ret;
    char *line = NULL;
    int hdrstart, len;
    const char *errmsg;
    char *p;
    bool headers_done;
    char base64_bit[4];
    int base64_chars = 0;

    ret = snew(struct sshcom_key);
    ret->comment[0] = '\0';
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(src))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----")) {
        errmsg = "file does not begin with ssh.com key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    headers_done = false;
    while (1) {
        if (!(line = bsgetline(src))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (!strcmp(line, "---- END SSH2 ENCRYPTED PRIVATE KEY ----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }
        if ((p = strchr(line, ':')) != NULL) {
            if (headers_done) {
                errmsg = "header found in body of key data";
                goto error;
            }
            *p++ = '\0';
            while (*p && isspace((unsigned char)*p)) p++;
            hdrstart = p - line;

            /*
             * Header lines can end in a trailing backslash for
             * continuation.
             */
            len = hdrstart + strlen(line+hdrstart);
            assert(!line[len]);
            while (line[len-1] == '\\') {
                char *line2;
                int line2len;

                line2 = bsgetline(src);
                if (!line2) {
                    errmsg = "unexpected end of file";
                    goto error;
                }

                line2len = strlen(line2);
                line = sresize(line, len + line2len + 1, char);
                strcpy(line + len - 1, line2);
                len += line2len - 1;
                assert(!line[len]);

                smemclr(line2, strlen(line2));
                sfree(line2);
                line2 = NULL;
            }
            p = line + hdrstart;
            if (!strcmp(line, "Comment")) {
                /* Strip quotes in comment if present. */
                if (p[0] == '"' && p[strlen(p)-1] == '"') {
                    p++;
                    p[strlen(p)-1] = '\0';
                }
                strncpy(ret->comment, p, sizeof(ret->comment));
                ret->comment[sizeof(ret->comment)-1] = '\0';
            }
        } else {
            headers_done = true;

            p = line;
            while (isbase64(*p)) {
                base64_bit[base64_chars++] = *p;
                if (base64_chars == 4) {
                    unsigned char out[3];

                    base64_chars = 0;

                    len = base64_decode_atom(base64_bit, out);

                    if (len <= 0) {
                        errmsg = "invalid base64 encoding";
                        goto error;
                    }

                    put_data(ret->keyblob, out, len);
                }

                p++;
            }
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}